

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O3

REF_STATUS ref_node_ghost_real(REF_NODE ref_node)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = ref_node_ghost_dbl(ref_node,ref_node->real,0xf);
  if (uVar1 == 0) {
    uVar1 = 0;
    if (0 < ref_node->naux) {
      uVar2 = ref_node_ghost_dbl(ref_node,ref_node->aux,ref_node->naux);
      if (uVar2 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x387,"ref_node_ghost_real",(ulong)uVar2,"ghost dbl");
        uVar1 = uVar2;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",900,
           "ref_node_ghost_real",(ulong)uVar1,"ghost dbl");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_node_ghost_real(REF_NODE ref_node) {
  RSS(ref_node_ghost_dbl(ref_node, ref_node->real, REF_NODE_REAL_PER),
      "ghost dbl");
  if (ref_node_naux(ref_node) > 0)
    RSS(ref_node_ghost_dbl(ref_node, ref_node->aux, ref_node_naux(ref_node)),
        "ghost dbl");
  return REF_SUCCESS;
}